

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

tuple<const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
* slang::ast::anon_unknown_0::getInterfacePortInfo
            (tuple<const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
             *__return_storage_ptr__,Scope *scope,InterfacePortHeaderSyntax *header)

{
  group_type_pointer pgVar1;
  Compilation *this;
  DotMemberClauseSyntax *pDVar2;
  group_type_pointer pgVar3;
  value_type_pointer pbVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  byte bVar8;
  uint uVar9;
  uint64_t uVar10;
  Diagnostic *pDVar11;
  ulong uVar12;
  DefinitionSymbol *pDVar13;
  ulong uVar14;
  long lVar15;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *this_00;
  undefined1 auVar16 [16];
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  byte bVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  byte bVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  byte bVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  byte bVar32;
  string_view sVar33;
  SourceRange SVar34;
  Token member;
  Token token;
  DefinitionLookupResult local_c8;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *local_a8;
  tuple<const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_a0;
  ulong local_98;
  ulong local_90;
  SourceRange local_88;
  uchar local_78;
  uchar uStack_77;
  uchar uStack_76;
  byte bStack_75;
  uchar uStack_74;
  uchar uStack_73;
  uchar uStack_72;
  byte bStack_71;
  uchar uStack_70;
  uchar uStack_6f;
  uchar uStack_6e;
  byte bStack_6d;
  uchar uStack_6c;
  uchar uStack_6b;
  uchar uStack_6a;
  byte bStack_69;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  Token local_58;
  Token local_48;
  
  this = scope->compilation;
  local_48.kind = (header->nameOrKeyword).kind;
  local_48._2_1_ = (header->nameOrKeyword).field_0x2;
  local_48.numFlags.raw = (header->nameOrKeyword).numFlags.raw;
  local_48.rawLen = (header->nameOrKeyword).rawLen;
  local_48.info = (header->nameOrKeyword).info;
  local_a0 = __return_storage_ptr__;
  sVar33 = parsing::Token::valueText(&local_48);
  local_88 = parsing::Token::range(&local_48);
  Compilation::getDefinition(&local_c8,this,sVar33,scope,local_88,(DiagCode)0xce0006);
  pDVar13 = (DefinitionSymbol *)local_c8.definition;
  if ((DefinitionSymbol *)local_c8.definition != (DefinitionSymbol *)0x0) {
    if (((Symbol *)&(local_c8.definition)->kind)->kind == Definition) {
      local_c8.definition = (Symbol *)0x0;
      local_c8.configRoot = (ConfigBlockSymbol *)0x0;
      if (*(DefinitionKind *)((long)pDVar13 + 0x48) == Interface) {
        pDVar2 = header->modport;
        if (pDVar2 != (DotMemberClauseSyntax *)0x0) {
          local_58.kind = (pDVar2->member).kind;
          local_58._2_1_ = (pDVar2->member).field_0x2;
          local_58.numFlags.raw = (pDVar2->member).numFlags.raw;
          local_58.rawLen = (pDVar2->member).rawLen;
          local_58.info = (pDVar2->member).info;
          local_c8._0_16_ = parsing::Token::valueText(&local_58);
          this_00 = (equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                    ((long)pDVar13 + 0x280);
          uVar10 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              this_00,(basic_string_view<char,_std::char_traits<char>_> *)&local_c8)
          ;
          uVar14 = uVar10 >> ((byte)(((flat_hash_set<std::string_view> *)((long)pDVar13 + 0x280))->
                                    table_).
                                    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                                    .arrays.groups_size_index & 0x3f);
          lVar15 = (uVar10 & 0xff) * 4;
          uVar17 = (&UNK_0043a38c)[lVar15];
          uVar18 = (&UNK_0043a38d)[lVar15];
          uVar19 = (&UNK_0043a38e)[lVar15];
          bVar20 = (&UNK_0043a38f)[lVar15];
          uVar12 = 0;
          uVar21 = uVar17;
          uVar22 = uVar18;
          uVar23 = uVar19;
          bVar24 = bVar20;
          uVar25 = uVar17;
          uVar26 = uVar18;
          uVar27 = uVar19;
          bVar28 = bVar20;
          uVar29 = uVar17;
          uVar30 = uVar18;
          uVar31 = uVar19;
          bVar32 = bVar20;
          do {
            pgVar3 = (((flat_hash_set<std::string_view> *)((long)pDVar13 + 0x280))->table_).
                     super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                     .arrays.groups_;
            pgVar1 = pgVar3 + uVar14;
            local_68 = pgVar1->m[0].n;
            uStack_67 = pgVar1->m[1].n;
            uStack_66 = pgVar1->m[2].n;
            bStack_65 = pgVar1->m[3].n;
            uStack_64 = pgVar1->m[4].n;
            uStack_63 = pgVar1->m[5].n;
            uStack_62 = pgVar1->m[6].n;
            bStack_61 = pgVar1->m[7].n;
            uStack_60 = pgVar1->m[8].n;
            uStack_5f = pgVar1->m[9].n;
            uStack_5e = pgVar1->m[10].n;
            bStack_5d = pgVar1->m[0xb].n;
            uStack_5c = pgVar1->m[0xc].n;
            uStack_5b = pgVar1->m[0xd].n;
            uStack_5a = pgVar1->m[0xe].n;
            bVar8 = pgVar1->m[0xf].n;
            auVar16[0] = -(local_68 == uVar17);
            auVar16[1] = -(uStack_67 == uVar18);
            auVar16[2] = -(uStack_66 == uVar19);
            auVar16[3] = -(bStack_65 == bVar20);
            auVar16[4] = -(uStack_64 == uVar21);
            auVar16[5] = -(uStack_63 == uVar22);
            auVar16[6] = -(uStack_62 == uVar23);
            auVar16[7] = -(bStack_61 == bVar24);
            auVar16[8] = -(uStack_60 == uVar25);
            auVar16[9] = -(uStack_5f == uVar26);
            auVar16[10] = -(uStack_5e == uVar27);
            auVar16[0xb] = -(bStack_5d == bVar28);
            auVar16[0xc] = -(uStack_5c == uVar29);
            auVar16[0xd] = -(uStack_5b == uVar30);
            auVar16[0xe] = -(uStack_5a == uVar31);
            auVar16[0xf] = -(bVar8 == bVar32);
            uVar9 = (uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe);
            bStack_59 = bVar8;
            if (uVar9 != 0) {
              pbVar4 = (((flat_hash_set<std::string_view> *)((long)pDVar13 + 0x280))->table_).
                       super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                       .arrays.elements_;
              local_a8 = this_00;
              local_98 = uVar14;
              local_90 = uVar12;
              local_78 = uVar17;
              uStack_77 = uVar18;
              uStack_76 = uVar19;
              bStack_75 = bVar20;
              uStack_74 = uVar21;
              uStack_73 = uVar22;
              uStack_72 = uVar23;
              bStack_71 = bVar24;
              uStack_70 = uVar25;
              uStack_6f = uVar26;
              uStack_6e = uVar27;
              bStack_6d = bVar28;
              uStack_6c = uVar29;
              uStack_6b = uVar30;
              uStack_6a = uVar31;
              bStack_69 = bVar32;
              do {
                iVar6 = 0;
                if (uVar9 != 0) {
                  for (; (uVar9 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
                  }
                }
                bVar7 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                        operator()(local_a8,(basic_string_view<char,_std::char_traits<char>_> *)
                                            &local_c8,
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   ((long)&pbVar4[uVar14 * 0xf]._M_len + (ulong)(uint)(iVar6 << 4)))
                ;
                if (bVar7) goto LAB_00257a55;
                uVar9 = uVar9 - 1 & uVar9;
              } while (uVar9 != 0);
              bVar8 = pgVar3[uVar14].m[0xf].n;
              uVar12 = local_90;
              uVar14 = local_98;
              this_00 = local_a8;
              uVar17 = local_78;
              uVar18 = uStack_77;
              uVar19 = uStack_76;
              bVar20 = bStack_75;
              uVar21 = uStack_74;
              uVar22 = uStack_73;
              uVar23 = uStack_72;
              bVar24 = bStack_71;
              uVar25 = uStack_70;
              uVar26 = uStack_6f;
              uVar27 = uStack_6e;
              bVar28 = bStack_6d;
              uVar29 = uStack_6c;
              uVar30 = uStack_6b;
              uVar31 = uStack_6a;
              bVar32 = bStack_69;
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar10 & 7] & bVar8) == 0) break;
            uVar5 = (((flat_hash_set<std::string_view> *)((long)pDVar13 + 0x280))->table_).
                    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                    .arrays.groups_size_mask;
            lVar15 = uVar14 + uVar12;
            uVar12 = uVar12 + 1;
            uVar14 = lVar15 + 1U & uVar5;
          } while (uVar12 <= uVar5);
          if (local_c8.definition != (Symbol *)0x0) {
            SVar34 = parsing::Token::range(&local_58);
            pDVar11 = Scope::addDiag(scope,(DiagCode)0x22000a,SVar34);
            Diagnostic::operator<<(pDVar11,(string_view)local_c8._0_16_);
            Diagnostic::operator<<(pDVar11,((Symbol *)&(pDVar13->super_Symbol).kind)->name);
            local_c8.definition = (Symbol *)0x0;
            local_c8.configRoot = (ConfigBlockSymbol *)0x0;
          }
        }
      }
      else {
        SVar34 = parsing::Token::range(&header->nameOrKeyword);
        pDVar11 = Scope::addDiag(scope,(DiagCode)0xa10006,SVar34);
        Diagnostic::operator<<(pDVar11,((Symbol *)&(pDVar13->super_Symbol).kind)->name);
        Diagnostic::addNote(pDVar11,(DiagCode)0x50001,
                            ((Symbol *)&(pDVar13->super_Symbol).kind)->location);
        pDVar13 = (DefinitionSymbol *)0x0;
      }
LAB_00257a55:
      (local_a0->
      super__Tuple_impl<0UL,_const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ).super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
      super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
      _M_head_impl._M_len = (size_t)local_c8.definition;
      (local_a0->
      super__Tuple_impl<0UL,_const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ).super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
      super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
      _M_head_impl._M_str = (char *)local_c8.configRoot;
      (local_a0->
      super__Tuple_impl<0UL,_const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ).super__Head_base<0UL,_const_slang::ast::DefinitionSymbol_*,_false>._M_head_impl = pDVar13;
      return local_a0;
    }
    SVar34 = parsing::Token::range(&local_48);
    pDVar11 = Scope::addDiag(scope,(DiagCode)0xce0006,SVar34);
    sVar33 = parsing::Token::valueText(&local_48);
    Diagnostic::operator<<(pDVar11,sVar33);
  }
  (local_a0->
  super__Tuple_impl<0UL,_const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ).super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
  super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl =
       (basic_string_view<char,_std::char_traits<char>_>)0x0;
  (local_a0->
  super__Tuple_impl<0UL,_const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ).super__Head_base<0UL,_const_slang::ast::DefinitionSymbol_*,_false>._M_head_impl =
       (DefinitionSymbol *)0x0;
  return local_a0;
}

Assistant:

std::tuple<const DefinitionSymbol*, std::string_view> getInterfacePortInfo(
    const Scope& scope, const InterfacePortHeaderSyntax& header) {

    auto& comp = scope.getCompilation();
    auto token = header.nameOrKeyword;
    auto def = comp.getDefinition(token.valueText(), scope, token.range(), diag::UnknownInterface)
                   .definition;
    if (!def || def->kind != SymbolKind::Definition) {
        // If we got a result then getDefinition didn't error, so do it ourselves.
        if (def)
            scope.addDiag(diag::UnknownInterface, token.range()) << token.valueText();
        return {nullptr, {}};
    }

    std::string_view modport;
    auto defSym = &def->as<DefinitionSymbol>();

    if (defSym->definitionKind != DefinitionKind::Interface) {
        auto& diag = scope.addDiag(diag::PortTypeNotInterfaceOrData, header.nameOrKeyword.range());
        diag << defSym->name;
        diag.addNote(diag::NoteDeclarationHere, defSym->location);
        defSym = nullptr;
    }
    else if (header.modport) {
        auto member = header.modport->member;
        modport = member.valueText();
        if (auto it = defSym->modports.find(modport);
            it == defSym->modports.end() && !modport.empty()) {
            auto& diag = scope.addDiag(diag::NotAModport, member.range());
            diag << modport;
            diag << defSym->name;
            modport = {};
        }
    }

    return {defSym, modport};
}